

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qimage.cpp
# Opt level: O2

void do_mirror_data<unsigned_char>
               (QImageData *dst,QImageData *src,int dstX0,int dstY0,int dstXIncr,int dstYIncr,int w,
               int h)

{
  uchar uVar1;
  uchar *puVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  uchar *puVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  int srcY;
  
  if (dst == src) {
    uVar10 = (uint)((long)w / 2);
    uVar8 = h;
    uVar11 = uVar10;
    if (dstY0 != 0) {
      uVar8 = h / 2;
      uVar11 = w;
    }
    if (dstX0 == 0) {
      uVar11 = w;
    }
    uVar7 = 0;
    if ((int)uVar11 < 1) {
      uVar11 = 0;
    }
    lVar3 = (long)dstY0;
    uVar5 = (ulong)uVar8;
    if ((int)uVar8 < 1) {
      uVar5 = 0;
    }
    for (; uVar7 != uVar5; uVar7 = uVar7 + 1) {
      lVar4 = src->bytes_per_line * uVar7;
      puVar2 = src->data;
      puVar6 = dst->data + dst->bytes_per_line * lVar3 + (long)dstX0;
      for (uVar9 = 0; uVar11 != uVar9; uVar9 = uVar9 + 1) {
        uVar1 = puVar2[uVar9 + lVar4];
        puVar2[uVar9 + lVar4] = *puVar6;
        *puVar6 = uVar1;
        puVar6 = puVar6 + dstXIncr;
      }
      lVar3 = lVar3 + dstYIncr;
    }
    if (((dstY0 != 0) && (dstX0 != 0)) && ((h & 1U) != 0)) {
      lVar3 = (long)(h / 2) * src->bytes_per_line;
      puVar2 = src->data;
      uVar5 = 0;
      uVar7 = (long)w / 2 & 0xffffffff;
      if ((int)uVar10 < 1) {
        uVar7 = uVar5;
      }
      puVar6 = puVar2 + lVar3 + dstX0;
      for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
        uVar1 = puVar2[uVar5 + lVar3];
        puVar2[uVar5 + lVar3] = *puVar6;
        *puVar6 = uVar1;
        puVar6 = puVar6 + dstXIncr;
      }
    }
  }
  else {
    uVar5 = 0;
    uVar7 = (ulong)(uint)w;
    if (w < 1) {
      uVar7 = uVar5;
    }
    lVar3 = (long)dstY0;
    uVar9 = (ulong)(uint)h;
    if (h < 1) {
      uVar9 = uVar5;
    }
    for (; uVar5 != uVar9; uVar5 = uVar5 + 1) {
      puVar6 = dst->data + dst->bytes_per_line * lVar3 + (long)dstX0;
      lVar4 = src->bytes_per_line;
      puVar2 = src->data;
      for (uVar12 = 0; uVar7 != uVar12; uVar12 = uVar12 + 1) {
        *puVar6 = puVar2[uVar12 + lVar4 * uVar5];
        puVar6 = puVar6 + dstXIncr;
      }
      lVar3 = lVar3 + dstYIncr;
    }
  }
  return;
}

Assistant:

inline void do_mirror_data(QImageData *dst, QImageData *src,
                                             int dstX0, int dstY0,
                                             int dstXIncr, int dstYIncr,
                                             int w, int h)
{
    if (dst == src) {
        // When mirroring in-place, stop in the middle for one of the directions, since we
        // are swapping the bytes instead of merely copying.
        const int srcXEnd = (dstX0 && !dstY0) ? w / 2 : w;
        const int srcYEnd = dstY0 ? h / 2 : h;
        for (int srcY = 0, dstY = dstY0; srcY < srcYEnd; ++srcY, dstY += dstYIncr) {
            T *srcPtr = (T *) (src->data + srcY * src->bytes_per_line);
            T *dstPtr = (T *) (dst->data + dstY * dst->bytes_per_line);
            for (int srcX = 0, dstX = dstX0; srcX < srcXEnd; ++srcX, dstX += dstXIncr)
                std::swap(srcPtr[srcX], dstPtr[dstX]);
        }
        // If mirroring both ways, the middle line needs to be mirrored horizontally only.
        if (dstX0 && dstY0 && (h & 1)) {
            int srcY = h / 2;
            int srcXEnd2 = w / 2;
            T *srcPtr = (T *) (src->data + srcY * src->bytes_per_line);
            for (int srcX = 0, dstX = dstX0; srcX < srcXEnd2; ++srcX, dstX += dstXIncr)
                std::swap(srcPtr[srcX], srcPtr[dstX]);
        }
    } else {
        for (int srcY = 0, dstY = dstY0; srcY < h; ++srcY, dstY += dstYIncr) {
            T *srcPtr = (T *) (src->data + srcY * src->bytes_per_line);
            T *dstPtr = (T *) (dst->data + dstY * dst->bytes_per_line);
            for (int srcX = 0, dstX = dstX0; srcX < w; ++srcX, dstX += dstXIncr)
                dstPtr[dstX] = srcPtr[srcX];
        }
    }
}